

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t FSE_readNCount_body_bmi2
                 (short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                 size_t hbSize)

{
  int iVar1;
  uint uVar2;
  U32 UVar3;
  int iVar4;
  uint *puVar5;
  uint *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  void *in_RDI;
  uint *in_R8;
  int count;
  int max;
  int repeats;
  size_t countSize;
  char buffer [8];
  int previous0;
  uint maxSV1;
  uint charnum;
  int bitCount;
  U32 bitStream;
  int threshold;
  int remaining;
  int nbBits;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  void *in_stack_ffffffffffffff48;
  uint local_84;
  uint local_7c;
  undefined1 local_70 [8];
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  int local_50;
  int local_4c;
  uint *local_48;
  long local_40;
  uint *local_38;
  uint *local_30;
  uint *local_28;
  uint *local_20;
  int *local_18;
  void *local_10;
  uint *local_8;
  
  local_40 = (long)in_RCX + (long)in_R8;
  local_60 = 0;
  local_64 = *in_RSI + 1;
  local_68 = 0;
  if (in_R8 < (uint *)0x8) {
    local_30 = in_R8;
    local_28 = in_RCX;
    memset(local_70,0,8);
    memcpy(local_70,local_28,(size_t)local_30);
    puVar5 = (uint *)FSE_readNCount((short *)in_RDX,in_RCX,in_R8,in_stack_ffffffffffffff48,0x1698e6)
    ;
    uVar2 = FSE_isError(0x1698f5);
    local_8 = puVar5;
    if ((uVar2 == 0) && (local_30 < puVar5)) {
      local_8 = (uint *)0xffffffffffffffec;
    }
  }
  else {
    local_48 = in_RCX;
    local_38 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memset(in_RDI,0,(ulong)(*in_RSI + 1) << 1);
    UVar3 = MEM_readLE32(in_stack_ffffffffffffff48);
    uVar2 = (UVar3 & 0xf) + 5;
    if (uVar2 < 0x10) {
      local_58 = UVar3 >> 4;
      local_5c = 4;
      *local_20 = uVar2;
      local_50 = (1 << (sbyte)uVar2) + 1;
      local_54 = 1 << (sbyte)uVar2;
      local_4c = (UVar3 & 0xf) + 6;
      do {
        if (local_68 != 0) {
          local_7c = ZSTD_countTrailingZeros32(local_58 ^ 0xffffffff | 0x80000000);
          while( true ) {
            local_7c = local_7c >> 1;
            if (local_7c < 0xc) break;
            local_60 = local_60 + 0x24;
            if ((uint *)(local_40 - 7U) < local_48) {
              local_5c = local_5c + (((int)local_40 + -7) - (int)local_48) * -8 & 0x1f;
              local_48 = (uint *)(local_40 + -4);
            }
            else {
              local_48 = (uint *)((long)local_48 + 3);
            }
            UVar3 = MEM_readLE32(in_stack_ffffffffffffff48);
            local_58 = UVar3 >> ((byte)local_5c & 0x1f);
            local_7c = ZSTD_countTrailingZeros32(local_58 ^ 0xffffffff | 0x80000000);
          }
          local_58 = local_58 >> ((byte)(local_7c << 1) & 0x1f);
          local_60 = (local_58 & 3) + local_7c * 3 + local_60;
          local_5c = local_7c * 2 + local_5c + 2;
          if (local_64 <= local_60) {
LAB_00169d84:
            if (local_50 != 1) {
              return 0xffffffffffffffec;
            }
            if (local_64 < local_60) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)local_5c) {
              return 0xffffffffffffffec;
            }
            *local_18 = local_60 - 1;
            return (long)local_48 + ((long)((int)(local_5c + 7) >> 3) - (long)local_38);
          }
          if (((uint *)(local_40 - 7U) < local_48) &&
             (local_40 - 4U < (ulong)((long)local_48 + (long)((int)local_5c >> 3)))) {
            local_5c = local_5c + (((int)local_40 + -4) - (int)local_48) * -8 & 0x1f;
            local_48 = (uint *)(local_40 + -4);
          }
          else {
            local_48 = (uint *)((long)local_48 + (long)((int)local_5c >> 3));
            local_5c = local_5c & 7;
          }
          UVar3 = MEM_readLE32(in_stack_ffffffffffffff48);
          local_58 = UVar3 >> ((byte)local_5c & 0x1f);
        }
        uVar2 = (local_54 * 2 + -1) - local_50;
        if ((local_58 & local_54 - 1U) < uVar2) {
          local_84 = local_58 & local_54 - 1U;
          iVar1 = local_4c + -1;
        }
        else {
          local_84 = local_58 & local_54 * 2 - 1U;
          iVar1 = local_4c;
          if (local_54 <= (int)local_84) {
            local_84 = local_84 - uVar2;
          }
        }
        local_5c = iVar1 + local_5c;
        iVar4 = local_84 - 1;
        iVar1 = iVar4;
        if (-1 < iVar4) {
          iVar1 = -iVar4;
        }
        local_50 = local_50 + iVar1;
        uVar2 = local_60 + 1;
        *(short *)((long)local_10 + (ulong)local_60 * 2) = (short)iVar4;
        local_68 = (uint)((iVar4 != 0 ^ 0xffU) & 1);
        local_60 = uVar2;
        if (local_50 < local_54) {
          if (local_50 < 2) goto LAB_00169d84;
          uVar2 = ZSTD_highbit32(0);
          local_4c = uVar2 + 1;
          local_54 = 1 << ((char)local_4c - 1U & 0x1f);
        }
        if (local_64 <= local_60) goto LAB_00169d84;
        if (((uint *)(local_40 - 7U) < local_48) &&
           (local_40 - 4U < (ulong)((long)local_48 + (long)((int)local_5c >> 3)))) {
          local_5c = local_5c + (((int)local_40 + -4) - (int)local_48) * -8 & 0x1f;
          local_48 = (uint *)(local_40 + -4);
        }
        else {
          local_48 = (uint *)((long)local_48 + (long)((int)local_5c >> 3));
          local_5c = local_5c & 7;
        }
        UVar3 = MEM_readLE32(in_stack_ffffffffffffff48);
        local_58 = UVar3 >> ((byte)local_5c & 0x1f);
      } while( true );
    }
    local_8 = (uint *)0xffffffffffffffd4;
  }
  return (size_t)local_8;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_readNCount_body_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize)
{
    return FSE_readNCount_body(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}